

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::experience_replay(memory_tree *b,single_learner *base)

{
  uint32_t cn;
  v_array<unsigned_int> tmp_path;
  uint32_t local_40 [2];
  v_array<unsigned_int> local_38;
  
  local_40[1] = 0;
  local_40[0] = random_sample_example_pop(b,local_40 + 1);
  if (-1 < (int)local_40[0]) {
    if ((b->current_pass == 0) || (b->dream_at_update != 0)) {
      local_38._begin = (uint *)CONCAT44(local_38._begin._4_4_,local_40[0]);
      insert_example(b,base,(uint32_t *)&local_38,false);
    }
    else {
      local_38.end_array = (uint *)0x0;
      local_38.erase_count = 0;
      local_38._begin = (uint *)0x0;
      local_38._end = (uint *)0x0;
      route_to_leaf(b,base,local_40,0,&local_38,true);
      if (local_38._begin != (uint *)0x0) {
        free(local_38._begin);
      }
    }
  }
  return;
}

Assistant:

void experience_replay(memory_tree& b, single_learner& base)
    {
        uint32_t cn = 0; //start from root, randomly descent down! 
	    int ec_id = random_sample_example_pop(b,cn);
	    if (ec_id >= 0){
            if (b.current_pass < 1)
            	insert_example(b, base, ec_id); //unsupervised learning
            else{
		if (b.dream_at_update == false){
	        	v_array<uint32_t> tmp_path = v_init<uint32_t>();
			route_to_leaf(b, base, ec_id, 0, tmp_path, true);
			tmp_path.delete_v();
		}
		else{
                	insert_example(b, base, ec_id);
		}
            }
        }
    }